

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  size_type sVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  bool bVar6;
  string local_288;
  string local_268 [32];
  undefined1 local_248 [8];
  ostringstream e;
  string local_d0;
  cmStrCmp local_b0;
  undefined1 local_8d;
  bool isCxxFeature;
  string local_80;
  cmStrCmp local_60;
  undefined1 local_39;
  string *psStack_38;
  bool isCFeature;
  string *error_local;
  string *lang_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  psStack_38 = error;
  error_local = lang;
  lang_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  sVar1 = cmGeneratorExpression::Find(feature);
  if (sVar1 == 0xffffffffffffffff) {
    ppcVar2 = std::cbegin<char_const*[8]>(&C_FEATURES);
    ppcVar3 = std::cend<char_const*[8]>(&C_FEATURES);
    std::__cxx11::string::string((string *)&local_80,(string *)lang_local);
    cmStrCmp::cmStrCmp(&local_60,&local_80);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_60);
    ppcVar3 = std::cend<char_const*[8]>(&C_FEATURES);
    bVar6 = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    local_39 = bVar6;
    if (bVar6) {
      std::__cxx11::string::operator=((string *)error_local,"C");
      this_local._7_1_ = 1;
    }
    else {
      ppcVar2 = std::cbegin<char_const*[63]>(&CXX_FEATURES);
      ppcVar3 = std::cend<char_const*[63]>(&CXX_FEATURES);
      std::__cxx11::string::string((string *)&local_d0,(string *)lang_local);
      cmStrCmp::cmStrCmp(&local_b0,&local_d0);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_b0);
      ppcVar3 = std::cend<char_const*[63]>(&CXX_FEATURES);
      bVar6 = ppcVar2 != ppcVar3;
      cmStrCmp::~cmStrCmp(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_8d = bVar6;
      if (bVar6) {
        std::__cxx11::string::operator=((string *)error_local,"CXX");
        this_local._7_1_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
        if (psStack_38 == (string *)0x0) {
          std::operator<<((ostream *)local_248,"Specified");
        }
        else {
          std::operator<<((ostream *)local_248,"specified");
        }
        poVar4 = std::operator<<((ostream *)local_248," unknown feature \"");
        poVar4 = std::operator<<(poVar4,(string *)lang_local);
        poVar4 = std::operator<<(poVar4,"\" for target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,"\".");
        if (psStack_38 == (string *)0x0) {
          this_00 = GetCMakeInstance(this);
          std::__cxx11::ostringstream::str();
          cmake::IssueMessage(this_00,FATAL_ERROR,&local_288,&this->Backtrace);
          std::__cxx11::string::~string((string *)&local_288);
        }
        else {
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)psStack_38,local_268);
          std::__cxx11::string::~string(local_268);
        }
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      }
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                ,0x115d,
                "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
               );
}

Assistant:

bool cmMakefile::CompileFeatureKnown(cmTarget const* target,
                                     const std::string& feature,
                                     std::string& lang,
                                     std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << target->GetName() << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           this->Backtrace);
  }
  return false;
}